

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rp.cpp
# Opt level: O2

void synchro_or_remove_pair<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>
               (hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int> *Q,TP_t *TP,
               text_t *T,cpair ab)

{
  triple_t tVar1;
  
  tVar1 = hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::operator[](Q,ab);
  if (tVar1.F_ab <= tVar1.L_ab >> 1) {
    synchronize<hf_queue<ll_el<unsigned_int,unsigned_int>,unsigned_int,unsigned_int>>(Q,TP,T,ab);
    return;
  }
  if (tVar1.F_ab < Q->min_freq) {
    hf_queue<ll_el<unsigned_int,_unsigned_int>,_unsigned_int,_unsigned_int>::remove(Q,(char *)ab);
    return;
  }
  return;
}

Assistant:

void synchro_or_remove_pair(queue_t & Q, TP_t & TP, text_t & T, cpair ab){

	assert(Q.contains(ab));

	auto q_el = Q[ab];
	itype F_ab = q_el.F_ab;
	itype L_ab = q_el.L_ab;

	if(F_ab <= L_ab/2){

		synchronize<queue_t>(Q, TP, T, ab);

	}else{

		if(F_ab < Q.minimum_frequency()){

			Q.remove(ab);

		}

	}

}